

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O2

bool __thiscall CEntity::GameLayerClipped(CEntity *this,vec2 CheckPos)

{
  CGameContext *pCVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  uVar5 = -(uint)(0.0 < CheckPos.field_0.x);
  iVar3 = (int)((float)(~uVar5 & 0xbf000000 | uVar5 & 0x3f000000) + CheckPos.field_0.x);
  uVar5 = -(uint)(0.0 < CheckPos.field_1.y);
  iVar4 = (int)((float)(~uVar5 & 0xbf000000 | uVar5 & 0x3f000000) + CheckPos.field_1.y);
  bVar2 = true;
  if (((-0x1920 < iVar3) && (-0x1920 < iVar4)) &&
     (pCVar1 = this->m_pGameWorld->m_pGameServer, iVar3 / 0x20 < (pCVar1->m_Collision).m_Width + 200
     )) {
    bVar2 = (pCVar1->m_Collision).m_Height + 200 <= iVar4 / 0x20;
  }
  return bVar2;
}

Assistant:

bool CEntity::GameLayerClipped(vec2 CheckPos)
{
	int rx = round_to_int(CheckPos.x) / 32;
	int ry = round_to_int(CheckPos.y) / 32;
	return (rx < -200 || rx >= GameServer()->Collision()->GetWidth()+200)
			|| (ry < -200 || ry >= GameServer()->Collision()->GetHeight()+200);
}